

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

int __thiscall
duckdb_re2::Compiler::UncachedRuneByteSuffix
          (Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  Inst *pIVar1;
  PatchList PVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  undefined7 in_register_00000031;
  PatchList PVar4;
  uint uVar5;
  ulong uVar6;
  Frag FVar7;
  uint uStack_1c;
  
  FVar7 = ByteRange(this,(int)CONCAT71(in_register_00000031,lo),
                    (int)CONCAT71(in_register_00000011,hi),foldcase);
  uStack_1c = FVar7.end.head;
  pIVar1 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
  if (next == 0) {
    PVar4 = (this->rune_range_).end;
    PVar2 = FVar7.end;
    uVar3 = (ulong)PVar4 & 0xffffffff;
    if (uVar3 == 0) {
      uVar3 = (ulong)PVar2 & 0xffffffff;
      PVar4 = PVar2;
    }
    else if (uStack_1c != 0) {
      uVar6 = (ulong)PVar4 >> 0x21;
      if (((ulong)PVar4 >> 0x20 & 1) == 0) {
        pIVar1[uVar6].out_opcode_ = pIVar1[uVar6].out_opcode_ & 0xf | uStack_1c << 4;
        PVar4 = PVar2;
      }
      else {
        pIVar1[uVar6].field_1.out1_ = uStack_1c;
        PVar4 = PVar2;
      }
    }
    (this->rune_range_).end = (PatchList)((ulong)PVar4 & 0xffffffff00000000 | uVar3);
  }
  else if (uStack_1c != 0) {
    do {
      uVar5 = uStack_1c >> 1;
      if ((uStack_1c & 1) == 0) {
        uStack_1c = pIVar1[uVar5].out_opcode_ >> 4;
        pIVar1[uVar5].out_opcode_ = pIVar1[uVar5].out_opcode_ & 0xf | next << 4;
      }
      else {
        uStack_1c = pIVar1[uVar5].field_1.out1_;
        pIVar1[uVar5].field_1.cap_ = next;
      }
    } while (uStack_1c != 0);
  }
  return FVar7.begin;
}

Assistant:

int Compiler::UncachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                     int next) {
  Frag f = ByteRange(lo, hi, foldcase);
  if (next != 0) {
    PatchList::Patch(inst_.data(), f.end, next);
  } else {
    rune_range_.end = PatchList::Append(inst_.data(), rune_range_.end, f.end);
  }
  return f.begin;
}